

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

void __thiscall Am_Drawonable_Impl::Print(Am_Drawonable_Impl *this,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  void *pvVar3;
  ostream *os_local;
  Am_Drawonable_Impl *this_local;
  
  pcVar1 = Am_Drawonable::Get_Title(&this->super_Am_Drawonable);
  std::operator<<(os,pcVar1);
  poVar2 = std::operator<<(os," (");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::hex);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,this);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::dec);
  std::operator<<(poVar2,")");
  return;
}

Assistant:

void
Am_Drawonable_Impl::Print(std::ostream &os) const
{
  os << this->Get_Title();
  os << " (" << std::hex << (void *)this << std::dec << ")";
}